

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

value_type * __thiscall
FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>
::fastAccessDx(FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>
               *this,int i)

{
  undefined4 in_EDX;
  Fad<double> *in_RSI;
  Fad<double> *in_RDI;
  Fad<double> *this_00;
  Fad<double> local_40;
  undefined4 in_stack_ffffffffffffffe8;
  
  this_00 = &local_40;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
  ::fastAccessDx((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                  *)this_00,(int)((ulong)in_RDI >> 0x20));
  Fad<double>::operator-(this_00);
  Fad<double>::Fad<FadUnaryMin<Fad<double>>>
            (in_RSI,(FadExpr<FadUnaryMin<Fad<double>_>_> *)
                    CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x1f0bc04);
  Fad<double>::~Fad(in_RDI);
  return in_RDI;
}

Assistant:

value_type fastAccessDx(int i) const { return - expr_.fastAccessDx(i);}